

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_quote(Curl_easy *data,_Bool init,ftpstate instate)

{
  FILEPROTO *pFVar1;
  connectdata *conn_00;
  bool bVar2;
  uint uVar3;
  CURLcode CVar4;
  anon_union_280_3_6d7b35ba_for_proto *pp;
  char *local_58;
  char *cmd;
  curl_slist *pcStack_48;
  int i;
  curl_slist *item;
  _Bool quote;
  ftp_conn *ftpc;
  connectdata *conn;
  FTP *ftp;
  CURLcode result;
  ftpstate instate_local;
  _Bool init_local;
  Curl_easy *data_local;
  
  pFVar1 = (data->req).p.file;
  conn_00 = data->conn;
  pp = &conn_00->proto;
  bVar2 = false;
  uVar3 = (uint)instate;
  if (uVar3 != 0xc) {
    if (uVar3 - 0xd < 2) {
      pcStack_48 = (data->set).prequote;
      goto LAB_00cf8046;
    }
    if (uVar3 == 0xf) {
      pcStack_48 = (data->set).postquote;
      goto LAB_00cf8046;
    }
  }
  pcStack_48 = (data->set).quote;
LAB_00cf8046:
  if (init) {
    (conn_00->proto).ftpc.count1 = 0;
  }
  else {
    (conn_00->proto).ftpc.count1 = (conn_00->proto).ftpc.count1 + 1;
  }
  if (pcStack_48 != (curl_slist *)0x0) {
    for (cmd._4_4_ = 0; cmd._4_4_ < (conn_00->proto).ftpc.count1 && pcStack_48 != (curl_slist *)0x0;
        cmd._4_4_ = cmd._4_4_ + 1) {
      pcStack_48 = pcStack_48->next;
    }
    if (pcStack_48 != (curl_slist *)0x0) {
      local_58 = pcStack_48->data;
      if (*local_58 == '*') {
        local_58 = local_58 + 1;
        (conn_00->proto).ftpc.count2 = 1;
      }
      else {
        (conn_00->proto).ftpc.count2 = 0;
      }
      CVar4 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s",local_58);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
      _ftp_state(data,instate);
      bVar2 = true;
    }
  }
  ftp._0_4_ = CURLE_OK;
  if (!bVar2) {
    switch(instate) {
    case '\f':
    default:
      ftp._0_4_ = ftp_state_cwd(data,conn_00);
      break;
    case '\r':
      if (pFVar1->fd == 0) {
        if ((conn_00->proto).ftpc.known_filesize == -1) {
          if (((*(ulong *)&(data->set).field_0x8ba >> 0x22 & 1) == 0) &&
             ((*(uint *)&(data->state).field_0x74c >> 0xe & 1) == 0)) {
            ftp._0_4_ = Curl_pp_sendf(data,&(pp->ftpc).pp,"SIZE %s",(conn_00->proto).ftpc.file);
            if ((CURLcode)ftp == CURLE_OK) {
              _ftp_state(data,'\x18');
            }
          }
          else {
            ftp._0_4_ = Curl_pp_sendf(data,&(pp->ftpc).pp,"RETR %s",(conn_00->proto).ftpc.file);
            if ((CURLcode)ftp == CURLE_OK) {
              _ftp_state(data,' ');
            }
          }
        }
        else {
          Curl_pgrsSetDownloadSize(data,(conn_00->proto).ftpc.known_filesize);
          ftp._0_4_ = ftp_state_retr(data,(conn_00->proto).ftpc.known_filesize);
        }
      }
      else {
        _ftp_state(data,'\0');
      }
      break;
    case '\x0e':
      ftp._0_4_ = ftp_state_ul_setup(data,false);
      break;
    case '\x0f':
    }
  }
  return (CURLcode)ftp;
}

Assistant:

static CURLcode ftp_state_quote(struct Curl_easy *data,
                                bool init,
                                ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  bool quote = FALSE;
  struct curl_slist *item;

  switch(instate) {
  case FTP_QUOTE:
  default:
    item = data->set.quote;
    break;
  case FTP_RETR_PREQUOTE:
  case FTP_STOR_PREQUOTE:
    item = data->set.prequote;
    break;
  case FTP_POSTQUOTE:
    item = data->set.postquote;
    break;
  }

  /*
   * This state uses:
   * 'count1' to iterate over the commands to send
   * 'count2' to store whether to allow commands to fail
   */

  if(init)
    ftpc->count1 = 0;
  else
    ftpc->count1++;

  if(item) {
    int i = 0;

    /* Skip count1 items in the linked list */
    while((i< ftpc->count1) && item) {
      item = item->next;
      i++;
    }
    if(item) {
      char *cmd = item->data;
      if(cmd[0] == '*') {
        cmd++;
        ftpc->count2 = 1; /* the sent command is allowed to fail */
      }
      else
        ftpc->count2 = 0; /* failure means cancel operation */

      result = Curl_pp_sendf(data, &ftpc->pp, "%s", cmd);
      if(result)
        return result;
      ftp_state(data, instate);
      quote = TRUE;
    }
  }

  if(!quote) {
    /* No more quote to send, continue to ... */
    switch(instate) {
    case FTP_QUOTE:
    default:
      result = ftp_state_cwd(data, conn);
      break;
    case FTP_RETR_PREQUOTE:
      if(ftp->transfer != PPTRANSFER_BODY)
        ftp_state(data, FTP_STOP);
      else {
        if(ftpc->known_filesize != -1) {
          Curl_pgrsSetDownloadSize(data, ftpc->known_filesize);
          result = ftp_state_retr(data, ftpc->known_filesize);
        }
        else {
          if(data->set.ignorecl || data->state.prefer_ascii) {
            /* 'ignorecl' is used to support download of growing files.  It
               prevents the state machine from requesting the file size from
               the server.  With an unknown file size the download continues
               until the server terminates it, otherwise the client stops if
               the received byte count exceeds the reported file size.  Set
               option CURLOPT_IGNORE_CONTENT_LENGTH to 1 to enable this
               behavior.

               In addition: asking for the size for 'TYPE A' transfers is not
               constructive since servers don't report the converted size. So
               skip it.
            */
            result = Curl_pp_sendf(data, &ftpc->pp, "RETR %s", ftpc->file);
            if(!result)
              ftp_state(data, FTP_RETR);
          }
          else {
            result = Curl_pp_sendf(data, &ftpc->pp, "SIZE %s", ftpc->file);
            if(!result)
              ftp_state(data, FTP_RETR_SIZE);
          }
        }
      }
      break;
    case FTP_STOR_PREQUOTE:
      result = ftp_state_ul_setup(data, FALSE);
      break;
    case FTP_POSTQUOTE:
      break;
    }
  }

  return result;
}